

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O0

void __thiscall hdc::Def::~Def(Def *this)

{
  Parameter *this_00;
  LocalVariable *this_01;
  SymbolTable *this_02;
  size_type sVar1;
  reference ppPVar2;
  reference ppLVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  Def *this_local;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00220a70;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::size
                      (&this->parameters);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppPVar2 = std::vector<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::operator[]
                        (&this->parameters,(long)local_14);
    this_00 = *ppPVar2;
    if (this_00 != (Parameter *)0x0) {
      Parameter::~Parameter(this_00);
      operator_delete(this_00);
    }
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>::size
                      (&this->localVariables);
    if (sVar1 <= (ulong)(long)local_18) break;
    ppLVar3 = std::vector<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>::operator[]
                        (&this->localVariables,(long)local_18);
    this_01 = *ppLVar3;
    if (this_01 != (LocalVariable *)0x0) {
      LocalVariable::~LocalVariable(this_01);
      operator_delete(this_01);
    }
    local_18 = local_18 + 1;
  }
  if (this->return_type != (Type *)0x0) {
    (*(this->return_type->super_ASTNode)._vptr_ASTNode[2])();
  }
  if (this->statements != (CompoundStatement *)0x0) {
    (*(this->statements->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  this_02 = this->symbolTable;
  if (this_02 != (SymbolTable *)0x0) {
    SymbolTable::~SymbolTable(this_02);
    operator_delete(this_02);
  }
  std::vector<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>::~vector
            (&this->localVariables);
  std::vector<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::~vector(&this->parameters);
  Token::~Token(&this->name);
  return;
}

Assistant:

Def::~Def() {
    for (int i = 0; i < parameters.size(); ++i) {
        delete parameters[i];
    }

    for (int i = 0; i < localVariables.size(); ++i) {
        delete localVariables[i];
    }

    delete return_type;
    delete statements;
    delete symbolTable;
}